

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSave.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionSave::InstructionSave(InstructionSave *this,Context *cx,uint num_save)

{
  Context local_90;
  
  std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::vector
            ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)&local_90,
             (vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)cx);
  local_90.mark = cx->mark;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_90.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             &(cx->paths_to_mark).super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::_Rb_tree(&local_90.paths_to_strings._M_t,&(cx->paths_to_strings)._M_t);
  local_90.flags = cx->flags;
  Instruction::Instruction(&this->super_Instruction,&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_90.paths_to_strings._M_t);
  if (local_90.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                    .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_00198890;
  *(uint *)&(this->super_Instruction).field_0x174 = num_save;
  return;
}

Assistant:

InstructionSave::InstructionSave( const Context &cx, unsigned num_save ) : Instruction( cx ), num_save( num_save ) {

}